

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

cram_record * cram_get_seq(cram_fd *fd)

{
  int iVar1;
  cram_record *pcVar2;
  cram_slice *local_28;
  cram_slice *s;
  cram_container *c;
  cram_fd *fd_local;
  
  c = (cram_container *)fd;
  while( true ) {
    s = (cram_slice *)c->offset;
    if (((s == (cram_slice *)0x0) || (s->soft_blk == (cram_block *)0x0)) || (s->nTN <= s->aTN)) {
      local_28 = cram_next_slice((cram_fd *)c,(cram_container **)&s);
      if (local_28 == (cram_slice *)0x0) {
        return (cram_record *)0x0;
      }
    }
    else {
      local_28 = (cram_slice *)s->soft_blk;
    }
    if (*(int *)(c->stats + 0x2d) == -2) break;
    if (local_28->crecs[s->aTN].ref_id < *(int *)(c->stats + 0x2d)) {
      s->aTN = s->aTN + 1;
    }
    else {
      if (local_28->crecs[s->aTN].ref_id != *(int *)(c->stats + 0x2d)) {
        *(undefined4 *)(c[0x3a].stats + 0x2d) = 1;
        cram_free_slice(local_28);
        s->soft_blk = (cram_block *)0x0;
        return (cram_record *)0x0;
      }
      if (*(int *)(c->stats + 0x2e) < local_28->crecs[s->aTN].apos) {
        *(undefined4 *)(c[0x3a].stats + 0x2d) = 1;
        cram_free_slice(local_28);
        s->soft_blk = (cram_block *)0x0;
        return (cram_record *)0x0;
      }
      if (*(int *)((long)c->stats + 0x16c) <= local_28->crecs[s->aTN].aend) break;
      s->aTN = s->aTN + 1;
    }
  }
  c->offset = (size_t)s;
  s->soft_blk = (cram_block *)local_28;
  pcVar2 = local_28->crecs;
  iVar1 = s->aTN;
  s->aTN = iVar1 + 1;
  return pcVar2 + iVar1;
}

Assistant:

cram_record *cram_get_seq(cram_fd *fd) {
    cram_container *c;
    cram_slice *s;

    for (;;) {
	c = fd->ctr;
	if (c && c->slice && c->curr_rec < c->max_rec) {
	    s = c->slice;
	} else {
	    if (!(s = cram_next_slice(fd, &c)))
		return NULL;
	}

	if (fd->range.refid != -2) {
	    if (s->crecs[c->curr_rec].ref_id < fd->range.refid) {
		c->curr_rec++;
		continue;
	    }

	    if (s->crecs[c->curr_rec].ref_id != fd->range.refid) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].apos > fd->range.end) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].aend < fd->range.start) {
		c->curr_rec++;
		continue;
	    }
	}

	break;
    }

    fd->ctr = c;
    c->slice = s;
    return &s->crecs[c->curr_rec++];
}